

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O1

void lsvm::hashset::resize_or_new_bucket(hashset *h,uint16_t bit)

{
  byte bVar1;
  uint uVar2;
  hashbucket *phVar3;
  uint8_t i;
  ulong uVar4;
  hashbucket *phVar5;
  uint *puVar6;
  long lVar7;
  equals_fp *pb;
  undefined6 in_register_00000032;
  equals_fp *b;
  
  pb = &h[1].equals + (CONCAT62(in_register_00000032,bit) & 0xffffffff);
  b = (equals_fp *)0x0;
  phVar5 = (hashbucket *)pb;
  for (phVar3 = (hashbucket *)*pb; phVar3 != (hashbucket *)0x0; phVar3 = phVar3->next) {
    if (((ulong)phVar3->bucket_size_indx != 0x17) &&
       ((b == (equals_fp *)0x0 ||
        ((uint)(&primes)[phVar3->bucket_size_indx] <
         (uint)(&primes)[((hashbucket *)*b)->bucket_size_indx])))) {
      b = (equals_fp *)phVar5;
    }
    phVar5 = phVar3;
  }
  if (b == (equals_fp *)0x0) {
    bVar1 = h->new_bucket_indx;
    uVar2 = (&primes)[bVar1];
  }
  else {
    uVar2 = (&primes)[((hashbucket *)*b)->bucket_size_indx];
    if ((((hashbucket *)*b)->count * 100) / uVar2 < 0x4b) {
      uVar4 = 1;
      lVar7 = 0;
      do {
        if (uVar2 < *(uint *)((long)&primes + lVar7)) goto LAB_00105bcf;
        uVar4 = (ulong)(byte)((char)uVar4 + 1);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x5c);
    }
    else {
      uVar4 = 0;
      puVar6 = &primes;
      do {
        if (uVar2 < *puVar6) goto LAB_00105bcf;
        uVar4 = uVar4 + 1;
        puVar6 = puVar6 + 1;
      } while (uVar4 != 0x18);
    }
    uVar4 = 0x17;
LAB_00105bcf:
    if ((&primes)[uVar4 & 0xff] != uVar2) {
      copy_into_new_bucket(h,(hashbucket **)pb,(hashbucket **)b,(uint32_t)(uVar4 & 0xff));
      return;
    }
    bVar1 = h->new_bucket_indx;
    uVar2 = (&primes)[bVar1];
  }
  phVar5 = (hashbucket *)memory::allocate((ulong)uVar2 * 0x10 + 0x10);
  phVar5->next = (hashbucket_t *)0x0;
  phVar5->count = 0;
  phVar5->bucket_size_indx = (uint)bVar1;
  memset(phVar5 + 1,0,(ulong)uVar2 * 0x10);
  phVar5->next = (hashbucket *)*pb;
  *pb = (equals_fp)phVar5;
  return;
}

Assistant:

inline entry* entries(hashbucket* b) { return reinterpret_cast<entry*>(b+1); }